

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void jit_rec_SET_N(Trace *trace,BcIns bc)

{
  IrRef IVar1;
  uint uVar2;
  
  uVar2 = bc >> 0x10;
  IVar1 = trace->const_loads[uVar2];
  if (IVar1 == 0) {
    IVar1 = ir_emit(trace,(ulong)(uVar2 << 0x10) + 1);
    trace->const_loads[uVar2] = IVar1;
  }
  trace->last_modified[(byte)(bc >> 8)] = IVar1;
  return;
}

Assistant:

void jit_rec_SET_N(Trace *trace, BcIns bc) {
	// Load the constant
	IrRef load = ir_load_const(trace, bc_arg16(bc));
	trace->last_modified[bc_arg1(bc)] = load;
}